

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O2

LY_ERR lyb_parse_model(lylyb_ctx *lybctx,uint32_t parse_options,ly_bool with_features,
                      lys_module **mod)

{
  ulong uVar1;
  char *name;
  anon_union_8_3_0df1e6ad_for_ly_set_2 aVar2;
  LY_ERR LVar3;
  int iVar4;
  lys_module *mod_00;
  lysp_feature *last;
  lys_module *feat_set_00;
  char *format;
  undefined7 in_register_00000011;
  ly_ctx *plVar5;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  char mod_rev [11];
  uint32_t idx;
  lys_module *local_58;
  char *mod_name;
  ly_set feat_set;
  
  mod_name = (char *)0x0;
  feat_set.size = 0;
  feat_set.count = 0;
  feat_set.field_2.dnodes = (lyd_node **)0x0;
  idx = 0;
  mod_00 = (lys_module *)0x0;
  feat_set_00 = (lys_module *)&feat_set;
  if ((int)CONCAT71(in_register_00000011,with_features) == 0) {
    feat_set_00 = mod_00;
  }
  pcVar8 = mod_rev;
  LVar3 = lyb_read_model(lybctx,&mod_name,pcVar8,(ly_set *)feat_set_00);
  name = mod_name;
  if (LVar3 != LY_SUCCESS) {
    LVar3 = LY_EMEM;
    goto LAB_001377ef;
  }
  if (mod_rev[0] == '\0') {
    mod_00 = ly_ctx_get_module_latest(lybctx->ctx,mod_name);
LAB_0013789c:
    if (mod_00 == (lys_module *)0x0) goto LAB_0013787f;
LAB_001378a1:
    if (mod_00->implemented != '\0') {
      if (with_features != '\0') {
        last = (lysp_feature *)0x0;
        local_58 = mod_00;
LAB_001378c2:
        do {
          mod_00 = local_58;
          last = lysp_feature_next(last,local_58->parsed,&idx);
          aVar2 = feat_set.field_2;
          if (last == (lysp_feature *)0x0) break;
          uVar1 = (ulong)feat_set._0_8_ >> 0x20;
          uVar7 = 0;
          do {
            if (uVar1 == uVar7) {
              if ((last->flags & 0x20) == 0) goto LAB_001378c2;
              plVar5 = lybctx->ctx;
              pcVar8 = last->name;
              pcVar6 = 
              "Invalid context for LYB data parsing, module \"%s\" has \"%s\" feature enabled.";
              goto LAB_001379d3;
            }
            pcVar8 = last->name;
            iVar4 = strcmp((char *)aVar2.dnodes[uVar7],pcVar8);
            uVar7 = uVar7 + 1;
          } while (iVar4 != 0);
          if ((last->flags & 0x20) == 0) {
            plVar5 = lybctx->ctx;
            pcVar6 = 
            "Invalid context for LYB data parsing, module \"%s\" has \"%s\" feature disabled.";
LAB_001379d3:
            mod_00 = local_58;
            LVar3 = LY_EINVAL;
            ly_log(plVar5,LY_LLERR,LY_EINVAL,pcVar6,name,pcVar8);
            goto LAB_001377ef;
          }
        } while( true );
      }
      lyb_cache_module_hash(mod_00);
      LVar3 = LY_SUCCESS;
      goto LAB_001377ef;
    }
    LVar3 = LY_SUCCESS;
    if ((parse_options >> 0x11 & 1) == 0) goto LAB_001377ef;
    if (mod_00->implemented != '\0') {
      LVar3 = LY_EINVAL;
      goto LAB_001377ef;
    }
    plVar5 = lybctx->ctx;
    pcVar6 = "@";
    if (mod_rev[0] == '\0') {
      pcVar6 = "";
      pcVar8 = "";
    }
    format = "Invalid context for LYB data parsing, module \"%s%s%s\" not implemented.";
  }
  else {
    mod_00 = ly_ctx_get_module(lybctx->ctx,mod_name,mod_rev);
    if (mod_00 != (lys_module *)0x0 || (parse_options >> 0x14 & 1) == 0) goto LAB_0013789c;
    mod_00 = ly_ctx_get_module_implemented(lybctx->ctx,name);
    if (((mod_00 != (lys_module *)0x0) && (mod_00->revision != (char *)0x0)) &&
       (iVar4 = strcmp(mod_00->revision,mod_rev), -1 < iVar4)) goto LAB_001378a1;
LAB_0013787f:
    if ((parse_options >> 0x11 & 1) == 0) {
      LVar3 = LY_SUCCESS;
      mod_00 = (lys_module *)0x0;
      goto LAB_001377ef;
    }
    plVar5 = lybctx->ctx;
    pcVar6 = "@";
    if (mod_rev[0] == '\0') {
      pcVar6 = "";
      pcVar8 = "";
    }
    format = "Invalid context for LYB data parsing, missing module \"%s%s%s\".";
    mod_00 = (lys_module *)0x0;
  }
  LVar3 = LY_EINVAL;
  ly_log(plVar5,LY_LLERR,LY_EINVAL,format,name,pcVar6,pcVar8);
LAB_001377ef:
  *mod = mod_00;
  free(mod_name);
  ly_set_erase(&feat_set,free);
  return LVar3;
}

Assistant:

static LY_ERR
lyb_parse_model(struct lylyb_ctx *lybctx, uint32_t parse_options, ly_bool with_features, const struct lys_module **mod)
{
    LY_ERR ret = LY_SUCCESS;
    const struct lys_module *m = NULL;
    char *mod_name = NULL, mod_rev[LY_REV_SIZE];
    struct ly_set feat_set = {0};
    struct lysp_feature *f = NULL;
    uint32_t i, idx = 0;
    ly_bool enabled;

    /* read module info */
    if ((ret = lyb_read_model(lybctx, &mod_name, mod_rev, with_features ? &feat_set : NULL))) {
        goto cleanup;
    }

    /* get the module */
    if (mod_rev[0]) {
        m = ly_ctx_get_module(lybctx->ctx, mod_name, mod_rev);
        if ((parse_options & LYD_PARSE_LYB_MOD_UPDATE) && !m) {
            /* try to use an updated module */
            m = ly_ctx_get_module_implemented(lybctx->ctx, mod_name);
            if (m && (!m->revision || (strcmp(m->revision, mod_rev) < 0))) {
                /* not an implemented module in a newer revision */
                m = NULL;
            }
        }
    } else {
        m = ly_ctx_get_module_latest(lybctx->ctx, mod_name);
    }

    if (!m || !m->implemented) {
        if (parse_options & LYD_PARSE_STRICT) {
            if (!m) {
                LOGERR(lybctx->ctx, LY_EINVAL, "Invalid context for LYB data parsing, missing module \"%s%s%s\".",
                        mod_name, mod_rev[0] ? "@" : "", mod_rev[0] ? mod_rev : "");
            } else if (!m->implemented) {
                LOGERR(lybctx->ctx, LY_EINVAL, "Invalid context for LYB data parsing, module \"%s%s%s\" not implemented.",
                        mod_name, mod_rev[0] ? "@" : "", mod_rev[0] ? mod_rev : "");
            }
            ret = LY_EINVAL;
            goto cleanup;
        }

        goto cleanup;
    }

    if (with_features) {
        /* check features */
        while ((f = lysp_feature_next(f, m->parsed, &idx))) {
            enabled = 0;
            for (i = 0; i < feat_set.count; ++i) {
                if (!strcmp(feat_set.objs[i], f->name)) {
                    enabled = 1;
                    break;
                }
            }

            if (enabled && !(f->flags & LYS_FENABLED)) {
                LOGERR(lybctx->ctx, LY_EINVAL, "Invalid context for LYB data parsing, module \"%s\" has \"%s\" feature disabled.",
                        mod_name, f->name);
                ret = LY_EINVAL;
                goto cleanup;
            } else if (!enabled && (f->flags & LYS_FENABLED)) {
                LOGERR(lybctx->ctx, LY_EINVAL, "Invalid context for LYB data parsing, module \"%s\" has \"%s\" feature enabled.",
                        mod_name, f->name);
                ret = LY_EINVAL;
                goto cleanup;
            }
        }
    }

    /* fill cached hashes, if not already */
    lyb_cache_module_hash(m);

cleanup:
    *mod = m;
    free(mod_name);
    ly_set_erase(&feat_set, free);
    return ret;
}